

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::PostDepthSampleMaskCase::iterate(PostDepthSampleMaskCase *this)

{
  pointer *pppSVar1;
  glUniform1iFunc p_Var2;
  GLuint program;
  Functions *gl;
  char cVar3;
  int iVar4;
  GLenum GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  undefined8 uVar8;
  ShaderProgram *pSVar9;
  undefined8 *puVar10;
  int i_1;
  int n;
  long lVar11;
  long *plVar12;
  char *pcVar13;
  long *plVar14;
  long *plVar15;
  GLint i;
  long lVar16;
  bool bVar17;
  GLboolean compiledMask [4];
  GLboolean expectedMask [4];
  GLuint indicesPre [3];
  GLfloat samplePos [2];
  GLubyte pixels [16];
  GLfloat texCoord [8];
  ProgramSources sources1a;
  GLuint indicesPost [6];
  ShaderProgram program1a;
  GLfloat verticesFar [9];
  GLfloat verticesNear [9];
  GLfloat verticesPost [12];
  ShaderProgram program2;
  ShaderProgram program1b;
  ProgramSources sources2;
  ProgramSources sources1b;
  char local_994 [4];
  value_type *local_990;
  uint local_984;
  uint local_980;
  GLenum local_97c;
  GLuint local_978;
  char acStack_974 [4];
  undefined8 local_970;
  undefined4 local_968;
  Functions *local_960;
  undefined1 local_958 [8];
  _func_int **local_950;
  undefined8 *local_948;
  _func_int *local_940 [2];
  int local_930;
  ios_base local_8e0 [264];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined1 local_7a8 [20];
  undefined2 uStack_794;
  undefined1 uStack_792;
  undefined1 uStack_791;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_718;
  undefined1 local_6f8 [32];
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined8 local_6c8;
  ShaderProgram local_6b8;
  undefined1 local_5e8 [8];
  _Alloc_hider local_5e0;
  char local_5d0 [16];
  int local_5c0;
  VertexComponentType local_5b8;
  VertexComponentConversion VStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_5a8;
  undefined8 *local_5a0;
  GLfloat local_598;
  long *local_590 [2];
  long local_580 [3];
  undefined8 local_568;
  undefined8 uStack_560;
  undefined4 local_558;
  undefined8 *local_550;
  undefined1 local_548 [8];
  _Alloc_hider local_540;
  char local_530 [16];
  int local_520;
  VertexComponentType local_518;
  VertexComponentConversion VStack_514;
  int iStack_510;
  int iStack_50c;
  int local_508;
  undefined8 *local_500;
  GLfloat local_4f8;
  long *local_4f0 [2];
  long local_4e0 [3];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  undefined8 *local_4b0;
  undefined1 local_4a8 [8];
  _Alloc_hider local_4a0;
  char local_490 [16];
  int local_480;
  VertexComponentType local_478;
  VertexComponentConversion VStack_474;
  int iStack_470;
  int iStack_46c;
  int local_468;
  undefined8 *local_460;
  GLfloat local_458;
  long *local_450 [2];
  long local_440 [3];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined4 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ShaderProgram local_370;
  ShaderProgram local_2a0;
  ProgramSources local_1d0;
  ProgramSources local_100;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_7b8 = 0x3f80000000000000;
  uStack_7b0 = 0x3f8000003f800000;
  local_7c8 = 0;
  uStack_7c0 = 0x3f800000;
  local_3c8 = 0x3e800000bf800000;
  uStack_3c0 = 0x3ecccccdbf800000;
  local_3d8 = 0xbf800000bf800000;
  uStack_3d0 = 0x3ecccccd3e800000;
  local_3b8 = 0x3e800000;
  local_3f8 = 0x3f400000bf800000;
  uStack_3f0 = 0x40400000bf800000;
  local_408 = 0xbf800000bf800000;
  uStack_400 = 0x404000003f400000;
  local_3e8 = 0x3f400000;
  local_388 = 0x3f80000000000000;
  uStack_380 = 0x3f800000;
  local_398 = 0xbf800000;
  uStack_390 = 0x3f800000bf800000;
  local_3a8 = 0xbf800000bf800000;
  uStack_3a0 = 0x3f80000000000000;
  local_970 = 0x100000000;
  local_968 = 2;
  local_6c8 = 0x300000002;
  local_6d8 = 0;
  uStack_6d4 = 1;
  uStack_6d0 = 2;
  uStack_6cc = 1;
  local_7a8._0_8_ = local_7a8 + 0x10;
  local_7a8._16_4_ = 0x74726576;
  uStack_794 = 0x7865;
  local_7a8._8_8_ = (pointer)0x6;
  uStack_792 = 0;
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>();
  local_930 = 0;
  local_4a8._0_4_ = local_958._0_4_;
  local_4a0._M_p = local_490;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,local_950,(long)local_948 + (long)local_950);
  local_480 = local_930;
  local_478 = VTX_COMP_FLOAT;
  VStack_474 = VTX_COMP_CONVERT_NONE;
  iStack_470 = 3;
  iStack_46c = 3;
  local_468 = 0;
  local_460 = &local_3d8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  pppSVar1 = &local_6b8.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x6f6f437865546e69;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0x6472;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xa;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 0;
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_950,pppSVar1);
  local_930 = 0;
  local_458 = (GLfloat)local_958._0_4_;
  plVar12 = local_440;
  local_450[0] = plVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_450,local_950,(long)local_948 + (long)local_950);
  local_440[2]._0_4_ = local_930;
  local_428 = 8;
  uStack_420 = 0x300000002;
  local_418 = 0;
  local_410 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar1) {
    operator_delete(local_6b8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
    operator_delete((void *)local_7a8._0_8_,
                    CONCAT17(uStack_791,CONCAT16(uStack_792,CONCAT24(uStack_794,local_7a8._16_4_)))
                    + 1);
  }
  local_7a8._0_8_ = local_7a8 + 0x10;
  local_7a8._16_4_ = 0x74726576;
  uStack_794 = 0x7865;
  local_7a8._8_8_ = (pointer)0x6;
  uStack_792 = 0;
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>();
  local_930 = 0;
  local_548._0_4_ = local_958._0_4_;
  local_540._M_p = local_530;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_540,local_950,(long)local_948 + (long)local_950);
  local_520 = local_930;
  local_518 = VTX_COMP_FLOAT;
  VStack_514 = VTX_COMP_CONVERT_NONE;
  iStack_510 = 3;
  iStack_50c = 3;
  local_508 = 0;
  local_500 = &local_408;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x6f6f437865546e69;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0x6472;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xa;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 0;
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_950,pppSVar1);
  local_930 = 0;
  local_4f8 = (GLfloat)local_958._0_4_;
  plVar14 = local_4e0;
  local_4f0[0] = plVar14;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f0,local_950,(long)local_948 + (long)local_950);
  local_4e0[2]._0_4_ = local_930;
  local_4c8 = 8;
  uStack_4c0 = 0x300000002;
  local_4b8 = 0;
  local_4b0 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar1) {
    operator_delete(local_6b8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
    operator_delete((void *)local_7a8._0_8_,
                    CONCAT17(uStack_791,CONCAT16(uStack_792,CONCAT24(uStack_794,local_7a8._16_4_)))
                    + 1);
  }
  local_7a8._0_8_ = local_7a8 + 0x10;
  local_7a8._16_4_ = 0x74726576;
  uStack_794 = 0x7865;
  local_7a8._8_8_ = (pointer)0x6;
  uStack_792 = 0;
  local_958._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_950 = local_940;
  std::__cxx11::string::_M_construct<char*>();
  local_930 = 0;
  local_5e8._0_4_ = local_958._0_4_;
  local_5e0._M_p = local_5d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0,local_950,(long)local_948 + (long)local_950);
  local_5c0 = local_930;
  local_5b8 = VTX_COMP_FLOAT;
  VStack_5b4 = VTX_COMP_CONVERT_NONE;
  iStack_5b0 = 3;
  iStack_5ac = 4;
  local_5a8 = 0;
  local_5a0 = &local_3a8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x6f6f437865546e69;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0x6472;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xa;
  local_6b8.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 0;
  local_958._0_4_ = 1;
  local_950 = local_940;
  local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppSVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_950,pppSVar1);
  local_930 = 0;
  local_598 = (GLfloat)local_958._0_4_;
  plVar15 = local_580;
  local_590[0] = plVar15;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_590,local_950,(long)local_948 + (long)local_950);
  local_580[2]._0_4_ = local_930;
  local_568 = 8;
  uStack_560 = 0x400000002;
  local_558 = 0;
  local_550 = &local_7c8;
  if (local_950 != local_940) {
    operator_delete(local_950,(ulong)(local_940[0] + 1));
  }
  if (local_6b8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar1) {
    operator_delete(local_6b8.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b8.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_960 = (Functions *)CONCAT44(extraout_var,iVar4);
  if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
    operator_delete((void *)local_7a8._0_8_,
                    CONCAT17(uStack_791,CONCAT16(uStack_792,CONCAT24(uStack_794,local_7a8._16_4_)))
                    + 1);
  }
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_7a8,0,0xac);
  local_6f8._0_8_ = (pointer)0x0;
  local_6f8[8] = 0;
  local_6f8._9_7_ = 0;
  local_6f8[0x10] = 0;
  local_6f8._17_8_ = 0;
  local_990 = &this->m_vertShader;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_7a8,&this->m_vertShader);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_790,&this->m_fragShader1a);
  gl = local_960;
  glu::ShaderProgram::ShaderProgram(&local_6b8,local_960,(ProgramSources *)local_7a8);
  if (local_6b8.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader program fail (non post_depth_coverage).");
    local_958 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,
               (char *)*(pointer)((long)*local_6b8.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 0x38),
               (long)*(pointer)((long)*local_6b8.m_shaders[0].
                                       super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x40));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
    lVar16 = *(long *)CONCAT53(local_6b8.m_shaders[1].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start._3_5_,
                               CONCAT12(local_6b8.m_shaders[1].
                                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                        local_6b8.m_shaders[1].
                                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_2_));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,*(char **)(lVar16 + 0x38),*(long *)(lVar16 + 0x40));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_950,local_6b8.m_program.m_info.infoLog._M_dataplus._M_p,
               local_6b8.m_program.m_info.infoLog._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
    std::ios_base::~ios_base(local_8e0);
  }
  else {
    memset(&local_100,0,0xac);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,local_990);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&this->m_fragShader1b);
    glu::ShaderProgram::ShaderProgram(&local_2a0,gl,&local_100);
    if (local_2a0.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Shader program fail (post_depth_coverage).");
      local_958 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,"PostDepthCoverage: enabled\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,
                 ((*local_2a0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_2a0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,
                 ((*local_2a0.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_2a0.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_950,local_2a0.m_program.m_info.infoLog._M_dataplus._M_p,
                 local_2a0.m_program.m_info.infoLog._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
      std::ios_base::~ios_base(local_8e0);
    }
    else {
      memset(&local_1d0,0,0xac);
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_1d0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_1d0._193_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1d0.sources,local_990);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1d0.sources + 1,&this->m_fragShader2);
      glu::ShaderProgram::ShaderProgram(&local_370,gl,&local_1d0);
      if (local_370.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Shader program fail (samples reader).");
        local_958 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Vertex: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,
                   ((*local_370.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_370.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Fragment: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,
                   ((*local_370.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_370.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950,"Program: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_950,local_370.m_program.m_info.infoLog._M_dataplus._M_p,
                   local_370.m_program.m_info.infoLog._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a77d62:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
        std::ios_base::~ios_base(local_8e0);
      }
      else {
        (*gl->clearColor)(0.0,0.0,0.0,0.0);
        uVar7 = (*gl->clearStencil)(0);
        uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
        local_990 = (value_type *)0x0;
        do {
          local_984 = (uint)uVar7;
          uVar8 = 0xb90;
          if ((char)uVar7 != '\0') {
            uVar8 = 0xb71;
          }
          local_97c = (GLenum)uVar8;
          bVar17 = false;
          uVar7 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
          do {
            local_980 = (uint)uVar7;
            pSVar9 = &local_2a0;
            if ((char)uVar7 != '\0') {
              pSVar9 = &local_6b8;
            }
            local_978 = (pSVar9->m_program).m_program;
            (*gl->useProgram)(local_978);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebufferMS);
            (*gl->viewport)(0,0,1,1);
            (*gl->enable)(0x809d);
            lVar16 = 0;
            do {
              (*gl->getMultisamplefv)(0x8e50,(GLuint)lVar16,(GLfloat *)local_958);
              GVar5 = (*gl->getError)();
              glu::checkError(GVar5,"glGetMultisamplefv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                              ,0x1aa);
              if ((!bVar17) || (0.7 <= (float)local_958._0_4_ + (float)local_958._4_4_)) {
                cVar3 = '\x01';
              }
              else {
                cVar3 = '\0';
              }
              acStack_974[lVar16] = cVar3;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            (*gl->enable)(local_97c);
            program = local_978;
            (*gl->clear)(0x4500);
            if (((ulong)local_990 & 1) != 0) {
              (*gl->stencilFunc)(0x207,1,0xff);
              (*gl->stencilOp)(0,0x1e01,0x1e01);
              (*gl->stencilMask)(0xff);
            }
            local_958 = (undefined1  [8])0x300000001;
            local_950 = (_func_int **)CONCAT44(local_950._4_4_,INDEXTYPE_UINT32);
            local_948 = &local_970;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,
                      (VertexArrayBinding *)local_4a8,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->clear)(0x4000);
            if (((ulong)local_990 & 1) != 0) {
              (*gl->stencilFunc)(0x205,1,0xff);
              (*gl->stencilMask)(0);
            }
            local_958 = (undefined1  [8])0x300000001;
            local_950._0_4_ = INDEXTYPE_UINT32;
            local_948 = &local_970;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,
                      (VertexArrayBinding *)local_548,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->disable)(0xb71);
            (*gl->disable)(local_97c);
            (*gl->bindFramebuffer)(0x8d40,0);
            (*gl->useProgram)(local_370.m_program.m_program);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebuffer);
            (*gl->viewport)(0,0,1,4);
            (*gl->activeTexture)(0x84c0);
            (*gl->bindTexture)(0x9100,this->m_textureMS);
            p_Var2 = gl->uniform1i;
            GVar6 = (*gl->getUniformLocation)(local_370.m_program.m_program,"texture");
            (*p_Var2)(GVar6,0);
            (*gl->clear)(0x4500);
            local_958 = (undefined1  [8])&DAT_600000001;
            local_950 = (_func_int **)CONCAT44(local_950._4_4_,2);
            local_948 = (undefined8 *)&local_6d8;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_370.m_program.m_program,
                      2,(VertexArrayBinding *)local_5e8,(PrimitiveList *)local_958,
                      (DrawUtilCallback *)0x0);
            (*gl->disable)(0x809d);
            local_7d8 = 0;
            uStack_7d0 = 0;
            (*gl->readPixels)(0,0,1,4,0x1908,0x1401,&local_7d8);
            GVar5 = (*gl->getError)();
            glu::checkError(GVar5,"glReadPixels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                            ,0x1ee);
            local_994[0] = '\0';
            local_994[1] = '\0';
            local_994[2] = '\0';
            local_994[3] = '\0';
            puVar10 = &local_7d8;
            lVar16 = 0;
            do {
              lVar11 = 0;
              do {
                bVar17 = true;
                if (local_994[lVar11] == '\0') {
                  bVar17 = *(char *)((long)puVar10 + lVar11) != '\0';
                }
                local_994[lVar11] = bVar17;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              lVar16 = lVar16 + 1;
              puVar10 = (undefined8 *)((long)puVar10 + 4);
            } while (lVar16 != 4);
            lVar16 = 0;
            do {
              if (acStack_974[lVar16] != local_994[lVar16]) {
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                local_958 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,"Wrong results for ",0x12);
                pcVar13 = "BUFFERCASE_DEPTH_STENCIL";
                if ((local_984 & 1) != 0) {
                  pcVar13 = "BUFFERCASE_DEPTH";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,pcVar13,
                           (ulong)((byte)~(byte)local_984 & 1) * 8 + 0x10);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_950," / ",3);
                pcVar13 = "PDCCASE_ENABLED";
                if ((local_980 & 1) != 0) {
                  pcVar13 = "PDCCASE_DISABLED";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_950,pcVar13,(ulong)(local_980 & 1) + 0xf);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_958,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                goto LAB_00a77d62;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            bVar17 = true;
            uVar7 = 0;
          } while ((local_980 & 1) != 0);
          local_990 = (value_type *)&DAT_00000001;
          uVar7 = 0;
        } while ((local_984 & 1) != 0);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      glu::ShaderProgram::~ShaderProgram(&local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_1d0.attribLocationBindings);
      lVar16 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_1d0.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar16));
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != -0x18);
    }
    glu::ShaderProgram::~ShaderProgram(&local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar16 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != -0x18);
  }
  glu::ShaderProgram::~ShaderProgram(&local_6b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_718);
  lVar16 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_7a8 + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  lVar16 = -0xa0;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -10;
    lVar16 = lVar16 + 0x50;
  } while (lVar16 != 0);
  lVar16 = -0xa0;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -10;
    lVar16 = lVar16 + 0x50;
  } while (lVar16 != 0);
  lVar16 = -0xa0;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -10;
    lVar16 = lVar16 + 0x50;
  } while (lVar16 != 0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthSampleMaskCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat texCoord[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat verticesNear[] = {
		-1.0f, -1.0f, 0.25f, 0.4f, -1.0f, 0.25f, -1.0f, 0.4f, 0.25f,
	};

	const GLfloat verticesFar[] = {
		-1.0f, -1.0f, 0.75f, 3.0f, -1.0f, 0.75f, -1.0f, 3.0f, 0.75f,
	};

	const GLfloat verticesPost[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indicesPre[] = { 0, 1, 2 };

	const GLuint indicesPost[] = { 0, 1, 2, 1, 2, 3 };

	glu::VertexArrayBinding vertexArraysNear[] = { glu::va::Float("vertex", 3, 3, 0, verticesNear),
												   glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysFar[] = { glu::va::Float("vertex", 3, 3, 0, verticesFar),
												  glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysPost[] = { glu::va::Float("vertex", 3, 4, 0, verticesPost),
												   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	//Prepare shaders
	ProgramSources sources1a = makeVtxFragSources(m_vertShader, m_fragShader1a);
	ShaderProgram  program1a(gl, sources1a);

	if (!program1a.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (non post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1a.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1a.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1a.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources1b = makeVtxFragSources(m_vertShader, m_fragShader1b);
	ShaderProgram  program1b(gl, sources1b);

	if (!program1b.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "PostDepthCoverage: enabled\n"
						   << "Vertex: " << program1b.getShaderInfo(SHADERTYPE_VERTEX).infoLog << "\n"
						   << "Fragment: " << program1b.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1b.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (samples reader).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clearStencil(0);

	//Iterate through all cases
	for (int bufferCase = BUFFERCASE_FIRST; bufferCase <= BUFFERCASE_LAST; ++bufferCase)
		for (int pdcCase = PDCCASE_FIRST; pdcCase <= PDCCASE_LAST; ++pdcCase)
		{
			GLint program = 0;
			if (pdcCase == PDCCASE_DISABLED)
				program = program1a.getProgram();
			else if (pdcCase == PDCCASE_ENABLED)
				program = program1b.getProgram();

			gl.useProgram(program);

			//Firstible use multisampled framebuffer
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebufferMS);
			gl.viewport(0, 0, 1, 1);

			gl.enable(GL_MULTISAMPLE);

			//Check which samples should be covered by first draw - calculate expected sample mask
			GLboolean expectedMask[4];

			for (GLint i = 0; i < 4; ++i)
			{
				GLfloat samplePos[2];
				gl.getMultisamplefv(GL_SAMPLE_POSITION, i, &samplePos[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetMultisamplefv");
				if (pdcCase == PDCCASE_ENABLED && (samplePos[0] + samplePos[1]) < 0.7f)
					expectedMask[i] = false;
				else
					expectedMask[i] = true;
			}

			if (bufferCase == BUFFERCASE_DEPTH)
				gl.enable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.enable(GL_STENCIL_TEST);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_ALWAYS, 1, 0xFF);
				gl.stencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
				gl.stencilMask(0xFF);
			}

			//Draw near primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysNear), vertexArraysNear,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.clear(GL_COLOR_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_NOTEQUAL, 1, 0xFF);
				gl.stencilMask(0x00);
			}

			//Draw far primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysFar), vertexArraysFar,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.disable(GL_DEPTH_TEST);
			if (bufferCase == BUFFERCASE_DEPTH)
				gl.disable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.disable(GL_STENCIL_TEST);

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			gl.useProgram(program2.getProgram());

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
			gl.viewport(0, 0, 1, 4);

			//Pass multisampled texture as a uniform
			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_textureMS);
			gl.uniform1i(gl.getUniformLocation(program2.getProgram(), "texture"), 0);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			//Draw multisampled texture to framebuffer
			glu::draw(m_context.getRenderContext(), program2.getProgram(), DE_LENGTH_OF_ARRAY(vertexArraysPost),
					  vertexArraysPost, glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPost), indicesPost));

			gl.disable(GL_MULTISAMPLE);

			//Read data from framebuffer
			GLubyte pixels[4 * 4];
			deMemset(pixels, 0, 4 * 4);

			gl.readPixels(0, 0, 1, 4, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

			//Verify the result
			GLboolean compiledMask[4];
			deMemset(compiledMask, 0, 4);
			for (int i = 0; i < 4; ++i)
			{
				for (int n			= 0; n < 4; ++n)
					compiledMask[n] = compiledMask[n] || (pixels[4 * i + n] != 0);
			}

			for (int n = 0; n < 4; ++n)
			{
				if (expectedMask[n] != compiledMask[n])
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong results for "
									   << (bufferCase == BUFFERCASE_DEPTH ? "BUFFERCASE_DEPTH" :
																			"BUFFERCASE_DEPTH_STENCIL")
									   << " / "
									   << (pdcCase == PDCCASE_DISABLED ? "PDCCASE_DISABLED" : "PDCCASE_ENABLED")
									   << tcu::TestLog::EndMessage;
					return STOP;
				}
			}
		}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}